

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::sse2::VirtualCurveIntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  bool bVar14;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar15;
  int iVar16;
  undefined4 uVar17;
  ulong unaff_RBX;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  float fVar33;
  float fVar42;
  float fVar43;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar44;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar81;
  undefined1 auVar79 [16];
  float fVar82;
  undefined1 auVar80 [16];
  float fVar83;
  float fVar84;
  float fVar87;
  float fVar88;
  undefined1 auVar85 [16];
  float fVar89;
  undefined1 auVar86 [16];
  uint uVar90;
  uint uVar91;
  uint uVar92;
  uint uVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar18 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar73 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar78 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar83 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar71 = fVar73 * 0.99999964;
  fVar72 = fVar78 * 0.99999964;
  fVar94 = fVar83 * 0.99999964;
  fVar73 = fVar73 * 1.0000004;
  fVar78 = fVar78 * 1.0000004;
  fVar83 = fVar83 * 1.0000004;
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar29 = (tray->tnear).field_0.i[k];
  auVar68._4_4_ = iVar29;
  auVar68._0_4_ = iVar29;
  auVar68._8_4_ = iVar29;
  auVar68._12_4_ = iVar29;
  iVar29 = (tray->tfar).field_0.i[k];
  iVar30 = iVar29;
  iVar31 = iVar29;
  iVar32 = iVar29;
  do {
    do {
      if (pSVar18 == stack) {
        return;
      }
      pSVar15 = pSVar18 + -1;
      pSVar18 = pSVar18 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar15->dist &&
             (float)pSVar15->dist != *(float *)(ray + k * 4 + 0x80));
    sVar21 = (pSVar18->ptr).ptr;
    do {
      if ((sVar21 & 0xf) == 0) {
        pfVar1 = (float *)(sVar21 + 0x20 + uVar24);
        auVar34._0_4_ = (*pfVar1 - fVar2) * fVar71;
        auVar34._4_4_ = (pfVar1[1] - fVar2) * fVar71;
        auVar34._8_4_ = (pfVar1[2] - fVar2) * fVar71;
        auVar34._12_4_ = (pfVar1[3] - fVar2) * fVar71;
        pfVar1 = (float *)(sVar21 + 0x20 + uVar19);
        auVar45._0_4_ = (*pfVar1 - fVar3) * fVar72;
        auVar45._4_4_ = (pfVar1[1] - fVar3) * fVar72;
        auVar45._8_4_ = (pfVar1[2] - fVar3) * fVar72;
        auVar45._12_4_ = (pfVar1[3] - fVar3) * fVar72;
        auVar35 = maxps(auVar34,auVar45);
        pfVar1 = (float *)(sVar21 + 0x20 + uVar23);
        auVar46._0_4_ = (*pfVar1 - fVar4) * fVar94;
        auVar46._4_4_ = (pfVar1[1] - fVar4) * fVar94;
        auVar46._8_4_ = (pfVar1[2] - fVar4) * fVar94;
        auVar46._12_4_ = (pfVar1[3] - fVar4) * fVar94;
        pfVar1 = (float *)(sVar21 + 0x20 + (uVar24 ^ 0x10));
        auVar51._0_4_ = (*pfVar1 - fVar2) * fVar73;
        auVar51._4_4_ = (pfVar1[1] - fVar2) * fVar73;
        auVar51._8_4_ = (pfVar1[2] - fVar2) * fVar73;
        auVar51._12_4_ = (pfVar1[3] - fVar2) * fVar73;
        pfVar1 = (float *)(sVar21 + 0x20 + (uVar19 ^ 0x10));
        auVar57._0_4_ = (*pfVar1 - fVar3) * fVar78;
        auVar57._4_4_ = (pfVar1[1] - fVar3) * fVar78;
        auVar57._8_4_ = (pfVar1[2] - fVar3) * fVar78;
        auVar57._12_4_ = (pfVar1[3] - fVar3) * fVar78;
        auVar52 = minps(auVar51,auVar57);
        pfVar1 = (float *)(sVar21 + 0x20 + (uVar23 ^ 0x10));
        auVar58._0_4_ = (*pfVar1 - fVar4) * fVar83;
        auVar58._4_4_ = (pfVar1[1] - fVar4) * fVar83;
        auVar58._8_4_ = (pfVar1[2] - fVar4) * fVar83;
        auVar58._12_4_ = (pfVar1[3] - fVar4) * fVar83;
        auVar47 = maxps(auVar46,auVar68);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar35,auVar47);
        auVar13._4_4_ = iVar30;
        auVar13._0_4_ = iVar29;
        auVar13._8_4_ = iVar31;
        auVar13._12_4_ = iVar32;
        auVar35 = minps(auVar58,auVar13);
        auVar35 = minps(auVar52,auVar35);
        auVar36._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar35._4_4_);
        auVar36._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar35._0_4_);
        auVar36._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar35._8_4_);
        auVar36._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar35._12_4_);
        uVar17 = movmskps((int)unaff_RBX,auVar36);
LAB_00205515:
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar17);
        bVar14 = true;
      }
      else {
        if ((int)(sVar21 & 0xf) == 2) {
          uVar20 = sVar21 & 0xfffffffffffffff0;
          fVar95 = fVar5 * *(float *)(uVar20 + 0x20) +
                   fVar6 * *(float *)(uVar20 + 0x50) + fVar7 * *(float *)(uVar20 + 0x80);
          fVar96 = fVar5 * *(float *)(uVar20 + 0x24) +
                   fVar6 * *(float *)(uVar20 + 0x54) + fVar7 * *(float *)(uVar20 + 0x84);
          fVar97 = fVar5 * *(float *)(uVar20 + 0x28) +
                   fVar6 * *(float *)(uVar20 + 0x58) + fVar7 * *(float *)(uVar20 + 0x88);
          fVar98 = fVar5 * *(float *)(uVar20 + 0x2c) +
                   fVar6 * *(float *)(uVar20 + 0x5c) + fVar7 * *(float *)(uVar20 + 0x8c);
          fVar33 = fVar5 * *(float *)(uVar20 + 0x30) +
                   fVar6 * *(float *)(uVar20 + 0x60) + fVar7 * *(float *)(uVar20 + 0x90);
          fVar42 = fVar5 * *(float *)(uVar20 + 0x34) +
                   fVar6 * *(float *)(uVar20 + 100) + fVar7 * *(float *)(uVar20 + 0x94);
          fVar43 = fVar5 * *(float *)(uVar20 + 0x38) +
                   fVar6 * *(float *)(uVar20 + 0x68) + fVar7 * *(float *)(uVar20 + 0x98);
          fVar44 = fVar5 * *(float *)(uVar20 + 0x3c) +
                   fVar6 * *(float *)(uVar20 + 0x6c) + fVar7 * *(float *)(uVar20 + 0x9c);
          fVar74 = fVar5 * *(float *)(uVar20 + 0x40) +
                   fVar6 * *(float *)(uVar20 + 0x70) + fVar7 * *(float *)(uVar20 + 0xa0);
          fVar75 = fVar5 * *(float *)(uVar20 + 0x44) +
                   fVar6 * *(float *)(uVar20 + 0x74) + fVar7 * *(float *)(uVar20 + 0xa4);
          fVar76 = fVar5 * *(float *)(uVar20 + 0x48) +
                   fVar6 * *(float *)(uVar20 + 0x78) + fVar7 * *(float *)(uVar20 + 0xa8);
          fVar77 = fVar5 * *(float *)(uVar20 + 0x4c) +
                   fVar6 * *(float *)(uVar20 + 0x7c) + fVar7 * *(float *)(uVar20 + 0xac);
          uVar90 = (uint)DAT_01fec6c0;
          uVar91 = DAT_01fec6c0._4_4_;
          uVar92 = DAT_01fec6c0._8_4_;
          uVar93 = DAT_01fec6c0._12_4_;
          uVar25 = -(uint)(1e-18 <= (float)((uint)fVar95 & uVar90));
          uVar26 = -(uint)(1e-18 <= (float)((uint)fVar96 & uVar91));
          uVar27 = -(uint)(1e-18 <= (float)((uint)fVar97 & uVar92));
          uVar28 = -(uint)(1e-18 <= (float)((uint)fVar98 & uVar93));
          auVar79._0_8_ = CONCAT44(~uVar26,~uVar25) & 0x219392ef219392ef;
          auVar79._8_4_ = ~uVar27 & 0x219392ef;
          auVar79._12_4_ = ~uVar28 & 0x219392ef;
          auVar64._4_4_ = (uint)fVar96 & uVar26;
          auVar64._0_4_ = (uint)fVar95 & uVar25;
          auVar64._8_4_ = (uint)fVar97 & uVar27;
          auVar64._12_4_ = (uint)fVar98 & uVar28;
          auVar79 = auVar79 | auVar64;
          uVar25 = -(uint)(1e-18 <= (float)((uint)fVar33 & uVar90));
          uVar26 = -(uint)(1e-18 <= (float)((uint)fVar42 & uVar91));
          uVar27 = -(uint)(1e-18 <= (float)((uint)fVar43 & uVar92));
          uVar28 = -(uint)(1e-18 <= (float)((uint)fVar44 & uVar93));
          auVar67._0_4_ = (uint)fVar33 & uVar25;
          auVar67._4_4_ = (uint)fVar42 & uVar26;
          auVar67._8_4_ = (uint)fVar43 & uVar27;
          auVar67._12_4_ = (uint)fVar44 & uVar28;
          auVar85._0_8_ = CONCAT44(~uVar26,~uVar25) & 0x219392ef219392ef;
          auVar85._8_4_ = ~uVar27 & 0x219392ef;
          auVar85._12_4_ = ~uVar28 & 0x219392ef;
          auVar85 = auVar85 | auVar67;
          uVar25 = -(uint)(1e-18 <= (float)((uint)fVar74 & uVar90));
          uVar26 = -(uint)(1e-18 <= (float)((uint)fVar75 & uVar91));
          uVar27 = -(uint)(1e-18 <= (float)((uint)fVar76 & uVar92));
          uVar28 = -(uint)(1e-18 <= (float)((uint)fVar77 & uVar93));
          auVar70._0_8_ = CONCAT44(~uVar26,~uVar25) & 0x219392ef219392ef;
          auVar70._8_4_ = ~uVar27 & 0x219392ef;
          auVar70._12_4_ = ~uVar28 & 0x219392ef;
          auVar35._4_4_ = (uint)fVar75 & uVar26;
          auVar35._0_4_ = (uint)fVar74 & uVar25;
          auVar35._8_4_ = (uint)fVar76 & uVar27;
          auVar35._12_4_ = (uint)fVar77 & uVar28;
          auVar70 = auVar70 | auVar35;
          auVar35 = rcpps(_DAT_01fec6c0,auVar79);
          fVar76 = auVar35._0_4_;
          fVar77 = auVar35._4_4_;
          fVar95 = auVar35._8_4_;
          fVar96 = auVar35._12_4_;
          fVar76 = (1.0 - auVar79._0_4_ * fVar76) * fVar76 + fVar76;
          fVar77 = (1.0 - auVar79._4_4_ * fVar77) * fVar77 + fVar77;
          fVar95 = (1.0 - auVar79._8_4_ * fVar95) * fVar95 + fVar95;
          fVar96 = (1.0 - auVar79._12_4_ * fVar96) * fVar96 + fVar96;
          auVar35 = rcpps(auVar35,auVar85);
          fVar97 = auVar35._0_4_;
          fVar98 = auVar35._4_4_;
          fVar81 = auVar35._8_4_;
          fVar82 = auVar35._12_4_;
          fVar97 = (1.0 - auVar85._0_4_ * fVar97) * fVar97 + fVar97;
          fVar98 = (1.0 - auVar85._4_4_ * fVar98) * fVar98 + fVar98;
          fVar81 = (1.0 - auVar85._8_4_ * fVar81) * fVar81 + fVar81;
          fVar82 = (1.0 - auVar85._12_4_ * fVar82) * fVar82 + fVar82;
          auVar35 = rcpps(auVar35,auVar70);
          fVar84 = auVar35._0_4_;
          fVar87 = auVar35._4_4_;
          fVar88 = auVar35._8_4_;
          fVar89 = auVar35._12_4_;
          fVar84 = (1.0 - auVar70._0_4_ * fVar84) * fVar84 + fVar84;
          fVar87 = (1.0 - auVar70._4_4_ * fVar87) * fVar87 + fVar87;
          fVar88 = (1.0 - auVar70._8_4_ * fVar88) * fVar88 + fVar88;
          fVar89 = (1.0 - auVar70._12_4_ * fVar89) * fVar89 + fVar89;
          fVar33 = (*(float *)(uVar20 + 0x20) * fVar2 +
                   *(float *)(uVar20 + 0x50) * fVar3 +
                   *(float *)(uVar20 + 0x80) * fVar4 + *(float *)(uVar20 + 0xb0)) * -fVar76;
          fVar42 = (*(float *)(uVar20 + 0x24) * fVar2 +
                   *(float *)(uVar20 + 0x54) * fVar3 +
                   *(float *)(uVar20 + 0x84) * fVar4 + *(float *)(uVar20 + 0xb4)) * -fVar77;
          auVar48._0_8_ = CONCAT44(fVar42,fVar33);
          auVar48._8_4_ =
               (*(float *)(uVar20 + 0x28) * fVar2 +
               *(float *)(uVar20 + 0x58) * fVar3 +
               *(float *)(uVar20 + 0x88) * fVar4 + *(float *)(uVar20 + 0xb8)) * -fVar95;
          auVar48._12_4_ =
               (*(float *)(uVar20 + 0x2c) * fVar2 +
               *(float *)(uVar20 + 0x5c) * fVar3 +
               *(float *)(uVar20 + 0x8c) * fVar4 + *(float *)(uVar20 + 0xbc)) * -fVar96;
          fVar74 = (*(float *)(uVar20 + 0x30) * fVar2 +
                   *(float *)(uVar20 + 0x60) * fVar3 +
                   *(float *)(uVar20 + 0x90) * fVar4 + *(float *)(uVar20 + 0xc0)) * -fVar97;
          fVar75 = (*(float *)(uVar20 + 0x34) * fVar2 +
                   *(float *)(uVar20 + 100) * fVar3 +
                   *(float *)(uVar20 + 0x94) * fVar4 + *(float *)(uVar20 + 0xc4)) * -fVar98;
          auVar65._0_8_ = CONCAT44(fVar75,fVar74);
          auVar65._8_4_ =
               (*(float *)(uVar20 + 0x38) * fVar2 +
               *(float *)(uVar20 + 0x68) * fVar3 +
               *(float *)(uVar20 + 0x98) * fVar4 + *(float *)(uVar20 + 200)) * -fVar81;
          auVar65._12_4_ =
               (*(float *)(uVar20 + 0x3c) * fVar2 +
               *(float *)(uVar20 + 0x6c) * fVar3 +
               *(float *)(uVar20 + 0x9c) * fVar4 + *(float *)(uVar20 + 0xcc)) * -fVar82;
          fVar43 = (*(float *)(uVar20 + 0x40) * fVar2 +
                   *(float *)(uVar20 + 0x70) * fVar3 +
                   *(float *)(uVar20 + 0xa0) * fVar4 + *(float *)(uVar20 + 0xd0)) * -fVar84;
          fVar44 = (*(float *)(uVar20 + 0x44) * fVar2 +
                   *(float *)(uVar20 + 0x74) * fVar3 +
                   *(float *)(uVar20 + 0xa4) * fVar4 + *(float *)(uVar20 + 0xd4)) * -fVar87;
          auVar53._0_8_ = CONCAT44(fVar44,fVar43);
          auVar53._8_4_ =
               (*(float *)(uVar20 + 0x48) * fVar2 +
               *(float *)(uVar20 + 0x78) * fVar3 +
               *(float *)(uVar20 + 0xa8) * fVar4 + *(float *)(uVar20 + 0xd8)) * -fVar88;
          auVar53._12_4_ =
               (*(float *)(uVar20 + 0x4c) * fVar2 +
               *(float *)(uVar20 + 0x7c) * fVar3 +
               *(float *)(uVar20 + 0xac) * fVar4 + *(float *)(uVar20 + 0xdc)) * -fVar89;
          fVar76 = fVar76 + fVar33;
          fVar77 = fVar77 + fVar42;
          fVar95 = fVar95 + auVar48._8_4_;
          fVar96 = fVar96 + auVar48._12_4_;
          auVar80._0_4_ = fVar97 + fVar74;
          auVar80._4_4_ = fVar98 + fVar75;
          auVar80._8_4_ = fVar81 + auVar65._8_4_;
          auVar80._12_4_ = fVar82 + auVar65._12_4_;
          auVar86._0_4_ = fVar84 + fVar43;
          auVar86._4_4_ = fVar87 + fVar44;
          auVar86._8_4_ = fVar88 + auVar53._8_4_;
          auVar86._12_4_ = fVar89 + auVar53._12_4_;
          auVar37._8_4_ = auVar65._8_4_;
          auVar37._0_8_ = auVar65._0_8_;
          auVar37._12_4_ = auVar65._12_4_;
          auVar35 = minps(auVar37,auVar80);
          auVar59._8_4_ = auVar53._8_4_;
          auVar59._0_8_ = auVar53._0_8_;
          auVar59._12_4_ = auVar53._12_4_;
          auVar47 = minps(auVar59,auVar86);
          auVar35 = maxps(auVar35,auVar47);
          auVar60._8_4_ = auVar48._8_4_;
          auVar60._0_8_ = auVar48._0_8_;
          auVar60._12_4_ = auVar48._12_4_;
          auVar47._4_4_ = fVar77;
          auVar47._0_4_ = fVar76;
          auVar47._8_4_ = fVar95;
          auVar47._12_4_ = fVar96;
          auVar64 = minps(auVar60,auVar47);
          auVar52._4_4_ = fVar77;
          auVar52._0_4_ = fVar76;
          auVar52._8_4_ = fVar95;
          auVar52._12_4_ = fVar96;
          auVar47 = maxps(auVar48,auVar52);
          auVar67 = maxps(auVar65,auVar80);
          auVar52 = maxps(auVar53,auVar86);
          auVar67 = minps(auVar67,auVar52);
          auVar52 = maxps(auVar68,auVar64);
          auVar52 = maxps(auVar52,auVar35);
          auVar38._4_4_ = iVar30;
          auVar38._0_4_ = iVar29;
          auVar38._8_4_ = iVar31;
          auVar38._12_4_ = iVar32;
          auVar35 = minps(auVar38,auVar47);
          auVar35 = minps(auVar35,auVar67);
          tNear.field_0.v[0] = auVar52._0_4_ * 0.99999964;
          tNear.field_0.v[1] = auVar52._4_4_ * 0.99999964;
          tNear.field_0.v[2] = auVar52._8_4_ * 0.99999964;
          tNear.field_0.v[3] = auVar52._12_4_ * 0.99999964;
          auVar54._4_4_ = -(uint)(tNear.field_0.v[1] <= auVar35._4_4_ * 1.0000004);
          auVar54._0_4_ = -(uint)(tNear.field_0.v[0] <= auVar35._0_4_ * 1.0000004);
          auVar54._8_4_ = -(uint)(tNear.field_0.v[2] <= auVar35._8_4_ * 1.0000004);
          auVar54._12_4_ = -(uint)(tNear.field_0.v[3] <= auVar35._12_4_ * 1.0000004);
          uVar17 = movmskps((int)unaff_RBX,auVar54);
          goto LAB_00205515;
        }
        bVar14 = false;
      }
      if (bVar14) {
        if (unaff_RBX == 0) {
          iVar16 = 4;
        }
        else {
          uVar20 = sVar21 & 0xfffffffffffffff0;
          lVar12 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          iVar16 = 0;
          sVar21 = *(size_t *)(uVar20 + lVar12 * 8);
          uVar22 = unaff_RBX - 1 & unaff_RBX;
          if (uVar22 != 0) {
            uVar25 = tNear.field_0.i[lVar12];
            lVar12 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            sVar10 = *(size_t *)(uVar20 + lVar12 * 8);
            uVar26 = tNear.field_0.i[lVar12];
            uVar22 = uVar22 - 1 & uVar22;
            if (uVar22 == 0) {
              if (uVar25 < uVar26) {
                (pSVar18->ptr).ptr = sVar10;
                pSVar18->dist = uVar26;
                pSVar18 = pSVar18 + 1;
              }
              else {
                (pSVar18->ptr).ptr = sVar21;
                pSVar18->dist = uVar25;
                pSVar18 = pSVar18 + 1;
                sVar21 = sVar10;
              }
            }
            else {
              auVar39._8_4_ = uVar25;
              auVar39._0_8_ = sVar21;
              auVar39._12_4_ = 0;
              auVar49._8_4_ = uVar26;
              auVar49._0_8_ = sVar10;
              auVar49._12_4_ = 0;
              lVar12 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              uVar11 = *(ulong *)(uVar20 + lVar12 * 8);
              iVar8 = tNear.field_0.i[lVar12];
              auVar55._8_4_ = iVar8;
              auVar55._0_8_ = uVar11;
              auVar55._12_4_ = 0;
              auVar61._8_4_ = -(uint)((int)uVar25 < (int)uVar26);
              uVar22 = uVar22 - 1 & uVar22;
              if (uVar22 == 0) {
                auVar61._4_4_ = auVar61._8_4_;
                auVar61._0_4_ = auVar61._8_4_;
                auVar61._12_4_ = auVar61._8_4_;
                auVar35 = auVar39 & auVar61 | ~auVar61 & auVar49;
                auVar47 = auVar49 & auVar61 | ~auVar61 & auVar39;
                auVar62._8_4_ = -(uint)(auVar35._8_4_ < iVar8);
                auVar62._0_8_ = CONCAT44(auVar62._8_4_,auVar62._8_4_);
                auVar62._12_4_ = auVar62._8_4_;
                auVar52 = auVar55 & auVar62 | ~auVar62 & auVar35;
                auVar40._8_4_ = -(uint)(auVar47._8_4_ < auVar52._8_4_);
                auVar40._4_4_ = auVar40._8_4_;
                auVar40._0_4_ = auVar40._8_4_;
                auVar40._12_4_ = auVar40._8_4_;
                *pSVar18 = (StackItemT<embree::NodeRefPtr<4>_>)
                           (~auVar40 & auVar47 | auVar52 & auVar40);
                pSVar18[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                             (auVar47 & auVar40 | ~auVar40 & auVar52);
                pSVar18 = pSVar18 + 2;
                sVar21 = ~auVar62._0_8_ & uVar11 | auVar35._0_8_ & auVar62._0_8_;
              }
              else {
                lVar12 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                  }
                }
                iVar9 = tNear.field_0.i[lVar12];
                auVar66._8_4_ = iVar9;
                auVar66._0_8_ = *(undefined8 *)(uVar20 + lVar12 * 8);
                auVar66._12_4_ = 0;
                auVar63._4_4_ = auVar61._8_4_;
                auVar63._0_4_ = auVar61._8_4_;
                auVar63._8_4_ = auVar61._8_4_;
                auVar63._12_4_ = auVar61._8_4_;
                auVar35 = auVar39 & auVar63 | ~auVar63 & auVar49;
                auVar47 = auVar49 & auVar63 | ~auVar63 & auVar39;
                auVar69._0_4_ = -(uint)(iVar8 < iVar9);
                auVar69._4_4_ = -(uint)(iVar8 < iVar9);
                auVar69._8_4_ = -(uint)(iVar8 < iVar9);
                auVar69._12_4_ = -(uint)(iVar8 < iVar9);
                auVar64 = auVar55 & auVar69 | ~auVar69 & auVar66;
                auVar70 = ~auVar69 & auVar55 | auVar66 & auVar69;
                auVar56._8_4_ = -(uint)(auVar47._8_4_ < auVar70._8_4_);
                auVar56._4_4_ = auVar56._8_4_;
                auVar56._0_4_ = auVar56._8_4_;
                auVar56._12_4_ = auVar56._8_4_;
                auVar67 = auVar47 & auVar56 | ~auVar56 & auVar70;
                auVar50._8_4_ = -(uint)(auVar35._8_4_ < auVar64._8_4_);
                auVar50._0_8_ = CONCAT44(auVar50._8_4_,auVar50._8_4_);
                auVar50._12_4_ = auVar50._8_4_;
                auVar52 = ~auVar50 & auVar35 | auVar64 & auVar50;
                auVar41._8_4_ = -(uint)(auVar52._8_4_ < auVar67._8_4_);
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                *pSVar18 = (StackItemT<embree::NodeRefPtr<4>_>)
                           (~auVar56 & auVar47 | auVar70 & auVar56);
                pSVar18[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                             (~auVar41 & auVar52 | auVar67 & auVar41);
                pSVar18[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                             (auVar52 & auVar41 | ~auVar41 & auVar67);
                pSVar18 = pSVar18 + 3;
                sVar21 = auVar35._0_8_ & auVar50._0_8_ | ~auVar50._0_8_ & auVar64._0_8_;
              }
            }
          }
        }
      }
      else {
        iVar16 = 6;
      }
    } while (iVar16 == 0);
    if (iVar16 == 6) {
      (**(code **)((long)This->leafIntersector +
                  (ulong)*(byte *)(sVar21 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context);
      iVar29 = *(int *)(ray + k * 4 + 0x80);
      iVar30 = iVar29;
      iVar31 = iVar29;
      iVar32 = iVar29;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }